

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

string * __thiscall
cs_impl::any::holder<cs::structure>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,holder<cs::structure> *this)

{
  domain_type *pdVar1;
  proxy *ppVar2;
  bool bVar3;
  int iVar4;
  var *pvVar5;
  undefined4 extraout_var;
  type_info *this_00;
  var func;
  var local_60;
  any local_58;
  string local_50;
  structure *local_30;
  
  pdVar1 = (this->mDat).m_data.super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::string((string *)&local_50,"to_string",(allocator *)&local_60);
  bVar3 = cs::domain_type::exist(pdVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar3) {
    pdVar1 = (this->mDat).m_data.super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__cxx11::string::string((string *)&local_50,"to_string",(allocator *)&local_58);
    pvVar5 = cs::domain_type::get_var(pdVar1,&local_50);
    ppVar2 = pvVar5->mDat;
    if (ppVar2 == (proxy *)0x0) {
      local_60.mDat = (proxy *)0x0;
      std::__cxx11::string::~string((string *)&local_50);
      this_00 = (type_info *)&void::typeinfo;
    }
    else {
      ppVar2->refcount = ppVar2->refcount + 1;
      local_60.mDat = ppVar2;
      std::__cxx11::string::~string((string *)&local_50);
      iVar4 = (*ppVar2->data->_vptr_baseHolder[2])();
      this_00 = (type_info *)CONCAT44(extraout_var,iVar4);
    }
    bVar3 = std::type_info::operator==(this_00,(type_info *)&cs::callable::typeinfo);
    if (bVar3) {
      local_30 = &this->mDat;
      make<cs::structure,cs::structure_const*>(&local_58,&local_30);
      cs::invoke<cs_impl::any>((cs *)&local_50,&local_60,&local_58);
      any::to_string_abi_cxx11_(__return_storage_ptr__,(any *)&local_50);
      recycle((any *)&local_50);
      recycle(&local_58);
      recycle(&local_60);
      return __return_storage_ptr__;
    }
    recycle(&local_60);
  }
  std::operator+(&local_50,"[cs::structure_",&(this->mDat).m_name);
  std::operator+(__return_storage_ptr__,&local_50,"]");
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}